

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O0

void bsp_destroy(void *handle)

{
  undefined8 *in_RDI;
  int i;
  bsp_tree *tree;
  int local_14;
  
  for (local_14 = 0; local_14 <= (int)(uint)*(byte *)(in_RDI + 1); local_14 = local_14 + 1) {
    array_destroy((void *)0x102ee2);
  }
  free((void *)*in_RDI);
  if (in_RDI[2] != 0) {
    _bsp_destroy_node((bsp_node *)0x102f16);
  }
  free(in_RDI);
  return;
}

Assistant:

void
bsp_destroy(
    void * handle )
{
    bsp_tree * tree;
    int i;

    tree = (bsp_tree *) handle;
    assert( tree != NULL );
    for ( i = 0; i <= tree->dimensions; i++ )
        array_destroy( tree->pointarrays[i] );
    free( tree->pointarrays );

    if ( tree->top != NULL )
        _bsp_destroy_node( tree->top );
    free( tree );
}